

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::VarintTest_TestWriteTwoElementStringVector_Test::
VarintTest_TestWriteTwoElementStringVector_Test
          (VarintTest_TestWriteTwoElementStringVector_Test *this)

{
  VarintTest_TestWriteTwoElementStringVector_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__VarintTest_TestWriteTwoElementStringVector_Test_003d1448;
  return;
}

Assistant:

TEST(VarintTest, TestWriteTwoElementStringVector)
{
    ByteBuffer buffer = ByteBuffer();
    std::vector<std::string> strings;
    strings.emplace_back("one");
    strings.emplace_back("two");
    Varint::WriteStringVector(buffer, strings);
    EXPECT_EQ("\002\004one\004two", buffer.ToString());
}